

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void persist_backup(void)

{
  int iVar1;
  FILE *__s;
  FILE *fp;
  
  if ((mem->backup_dirty & 1U) == 0) {
    iVar1 = mem->backup_persist_countdown + -1;
    mem->backup_persist_countdown = iVar1;
    if (((iVar1 == 0) && (bus->backup_type != UNKNOWN)) && (mem->backup != (uint8_t *)0x0)) {
      __s = fopen(mem->backup_path,"wb");
      if (__s != (FILE *)0x0) {
        fwrite(mem->backup,mem->backup_size,1,__s);
        fclose(__s);
      }
      mem->backup_dirty = false;
    }
  }
  else {
    mem->backup_persist_countdown = 10;
    mem->backup_dirty = false;
  }
  return;
}

Assistant:

void persist_backup() {
    if (mem->backup_dirty) {
        mem->backup_persist_countdown = BACKUP_PERSIST_DEBOUNCE_FRAMES;
        mem->backup_dirty = 0;
    } else if (--mem->backup_persist_countdown == 0) {
        if (bus->backup_type != UNKNOWN && mem->backup != NULL) {
            FILE *fp = fopen(mem->backup_path, "wb");
            if (fp != NULL) {
                fwrite(mem->backup, mem->backup_size, 1, fp);
                fclose(fp);
            }
            mem->backup_dirty = false;
        }
    }
}